

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.cpp
# Opt level: O2

void __thiscall
depspawn::internal::Workitem::insert_in_worklist(Workitem *this,AbstractRunner *itask)

{
  __atomic_flag_data_type _Var1;
  Workitem *pWVar2;
  arg_info *this_00;
  undefined8 uVar3;
  long lVar4;
  bool bVar5;
  arg_info **ppaVar6;
  long *plVar7;
  value_t vVar8;
  _dep *p_Var9;
  value_t vVar10;
  _dep **pp_Var11;
  uint uVar12;
  _dep **pp_Var13;
  long *plVar14;
  Workitem *pWVar15;
  int iVar16;
  arg_info *paVar17;
  Workitem **__p1;
  ulong uVar18;
  long alStack_70 [3];
  ulong local_58;
  long *local_50;
  Workitem *local_48;
  Workitem *local_40;
  int local_34;
  
  uVar12 = (uint)this->nargs_;
  lVar4 = -((ulong)(uVar12 + 1) * 8 + 0xf & 0xfffffffffffffff0);
  plVar14 = (long *)((long)alStack_70 + lVar4 + 8);
  ppaVar6 = &this->args;
  plVar7 = plVar14;
  while (paVar17 = *ppaVar6, paVar17 != (arg_info *)0x0) {
    *plVar7 = (long)paVar17;
    plVar7 = plVar7 + 1;
    ppaVar6 = &paVar17->next;
  }
  alStack_70[2] = (ulong)uVar12;
  local_50 = plVar14;
  plVar14[(int)uVar12] = 0;
  this->task = itask;
  pWVar15 = this->father;
  __p1 = &this->next;
  this->next = (anonymous_namespace)::worklist;
  *(undefined8 *)((long)alStack_70 + lVar4) = 5;
  uVar3 = *(undefined8 *)((long)alStack_70 + lVar4);
  do {
    *(undefined8 *)((long)alStack_70 + lVar4) = 0x10dcb3;
    bVar5 = std::atomic<depspawn::internal::Workitem_*>::compare_exchange_weak
                      ((atomic<depspawn::internal::Workitem_*> *)&(anonymous_namespace)::worklist,
                       __p1,this,(memory_order)uVar3);
  } while (!bVar5);
  local_58 = 0;
  iVar16 = 0;
  local_48 = this;
  while (pWVar2 = *__p1, pWVar2 != (Workitem *)0x0) {
    if (pWVar2 != this) {
      if (pWVar2 == pWVar15) {
        pWVar15 = pWVar2->father;
        if (pWVar15 == (Workitem *)0x0) {
          pWVar15 = (Workitem *)0x0;
        }
        else {
          *(undefined8 *)((long)alStack_70 + lVar4) = 0x10ddd5;
          bVar5 = is_contained(this,pWVar15);
          if (bVar5) {
            *(byte *)&this->optFlags_ = (byte)this->optFlags_ | 2;
            break;
          }
        }
      }
      else if ((short)pWVar2->status < 4) {
        paVar17 = pWVar2->args;
        uVar12 = 0;
        plVar7 = local_50;
        plVar14 = local_50;
        local_40 = pWVar15;
        local_34 = iVar16;
        do {
          this_00 = (arg_info *)*plVar7;
LAB_0010dd0e:
          this = local_48;
          if ((paVar17 == (arg_info *)0x0) || (this_00 == (arg_info *)0x0)) goto LAB_0010dde2;
          uVar18 = (ulong)uVar12;
          if (this_00->rank == '\0') {
            if (paVar17->wr == true) {
              vVar8 = paVar17->addr;
              vVar10 = this_00->addr;
            }
            else {
              vVar8 = paVar17->addr;
              vVar10 = this_00->addr;
              if (this_00->wr != true) goto LAB_0010dd91;
            }
            bVar5 = vVar10 <= (paVar17->size + vVar8) - 1;
            if (vVar10 < vVar8) {
              bVar5 = vVar8 <= (this_00->size + vVar10) - 1;
            }
            if (!bVar5) goto LAB_0010dd91;
LAB_0010de24:
            this = local_48;
            LOCK();
            (local_48->ndependencies).super___atomic_base<int>._M_i =
                 (local_48->ndependencies).super___atomic_base<int>._M_i + 1;
            UNLOCK();
            *(undefined8 *)((long)alStack_70 + lVar4) = 0x10de38;
            p_Var9 = LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>::intl_malloc
                               ((LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *)
                                _dep::Pool);
            p_Var9->next = (_dep *)0x0;
            p_Var9->w = this;
            do {
              LOCK();
              _Var1 = (pWVar2->deps_mutex_).super___atomic_flag_base._M_i;
              (pWVar2->deps_mutex_).super___atomic_flag_base._M_i = true;
              UNLOCK();
            } while (_Var1 != false);
            pp_Var13 = &pWVar2->lastdep;
            if (pWVar2->deps == (_dep *)0x0) {
              pp_Var11 = &pWVar2->deps;
            }
            else {
              pp_Var11 = pp_Var13;
              pp_Var13 = &(*pp_Var13)->next;
            }
            *pp_Var13 = p_Var9;
            *pp_Var11 = p_Var9;
            (pWVar2->deps_mutex_).super___atomic_flag_base._M_i = false;
            if (paVar17->wr == true) {
              if (this_00->rank == '\0') {
                if ((this_00->addr < paVar17->addr) ||
                   (paVar17->addr + paVar17->size < this_00->addr + this_00->size))
                goto LAB_0010dde2;
              }
              else {
                *(undefined8 *)((long)alStack_70 + lVar4) = 0x10de8e;
                bVar5 = arg_info::is_contained_array(this_00,paVar17);
                if (!bVar5) goto LAB_0010dde2;
              }
              for (; (long)uVar18 < (long)(int)alStack_70[2]; uVar18 = uVar18 + 1) {
                local_50[uVar18] = local_50[uVar18 + 1];
              }
              alStack_70[2] = (long)((int)alStack_70[2] - 1);
            }
            else {
LAB_0010dde2:
            }
            iVar16 = local_34 + (uint)((short)pWVar2->status < 2);
            local_58 = (ulong)((int)local_58 + (uint)(pWVar2->status == Ready));
            pWVar15 = local_40;
            if (pWVar2->status == Filling) {
              *(byte *)&this->optFlags_ = (byte)this->optFlags_ | 1;
            }
            break;
          }
          vVar8 = paVar17->addr;
          vVar10 = this_00->addr;
          if (vVar8 == vVar10) {
            *(undefined8 *)((long)alStack_70 + lVar4) = 0x10ddaa;
            bVar5 = arg_info::overlap_array(this_00,paVar17);
            plVar14 = local_50;
            if (bVar5) goto LAB_0010de24;
          }
          else {
LAB_0010dd91:
            if (vVar8 < vVar10) goto code_r0x0010dd96;
          }
          uVar12 = uVar12 + 1;
          plVar7 = plVar14 + uVar18 + 1;
        } while( true );
      }
    }
    __p1 = &pWVar2->next;
  }
  pWVar15 = local_48;
  if ((int)local_58 <= FAST_THRESHOLD) {
    bVar5 = false;
    if (((int)local_58 <= Nthreads) || (bVar5 = false, iVar16 <= FAST_THRESHOLD)) goto LAB_0010df13;
  }
  bVar5 = true;
LAB_0010df13:
  if ((local_48->ndependencies).super___atomic_base<int>._M_i == 0) {
    *(undefined8 *)((long)alStack_70 + lVar4) = 0x10df2b;
    post(pWVar15);
  }
  else {
    local_48->status = Waiting;
  }
  if (!bVar5) {
    return;
  }
  TaskPool::try_run(TP);
  return;
code_r0x0010dd96:
  paVar17 = paVar17->next;
  goto LAB_0010dd0e;
}

Assistant:

void Workitem::insert_in_worklist(AbstractRunner* itask)
    { Workitem* p;
      arg_info *arg_p, *arg_w;

      //Save original list of arguments
      int nargs = static_cast<int>(nargs_);
      arg_info* argv[nargs+1];
      arg_w = args;
      for (int i = 0; arg_w != nullptr; i++) {
        argv[i] = arg_w;     //printf("Fill %d %lu\n", i, arg_w->addr);
        arg_w = arg_w->next;
      }
      argv[nargs] = nullptr;
      
      DEPSPAWN_PROFILEDEFINITION(unsigned int profile_workitems_in_list_lcl = 0,
                                              profile_workitems_in_list_active_lcl = 0);
      DEPSPAWN_PROFILEDEFINITION(bool profile_early_termination_lcl = false);
      
      DEPSPAWN_PROFILEACTION(profile_jobs++);
      
#ifdef DEPSPAWN_FAST_START
#ifdef DEPSPAWN_USE_TBB
      AbstractBoxedFunction *stolen_abf = nullptr;
      static constexpr int FAST_ARR_SZ  = 16;
      Workitem* fast_arr[FAST_ARR_SZ];
#else
      bool steal_work = false;
#endif
      int nready = 0, nfillwait = 0;
#endif
      
      task = itask;
      
      Workitem* ancestor = father;

      next = worklist.load(std::memory_order_relaxed);
      while(!worklist.compare_exchange_weak(next, this));

      for(p = next; p != nullptr; p = p->next) {

        DEPSPAWN_PROFILEACTION(profile_workitems_in_list_lcl++);
        
        // sometimes p == this, even if it shouldn't
        if(p == this) { // fprintf(stderr, "myself?\n");
          continue; // FIXIT
        }
        if(p == ancestor) {
          ancestor = p->father;
          /// TODO: is_contained should be adapted to use argv
          if ( (ancestor != nullptr) && is_contained(this, ancestor)) {
            DEPSPAWN_PROFILEACTION(profile_early_termination_lcl = true);
            optFlags_ |= OptFlags::FatherScape;
            break;
          }
        } else {
          const auto tmp_status = p->status;
          if(tmp_status < Status_t::Done) {
            DEPSPAWN_PROFILEACTION(profile_workitems_in_list_active_lcl++);
            int arg_w_i = 0;
            arg_p = p->args; // preexisting workitem
            arg_w = argv[0]; // New workitem
            while(arg_p && arg_w) {

              const bool conflict = arg_w->is_array()
              ? ( (arg_p->addr == arg_w->addr) && arg_w->overlap_array(arg_p) )
              : ( (arg_p->wr || arg_w->wr) && overlaps(arg_p, arg_w) );
              
              if(conflict) { // Found a dependency
                ndependencies++;
                Workitem::_dep* newdep = Workitem::_dep::Pool.malloc();
                newdep->next = nullptr;
                newdep->w = this;
                
                while (p->deps_mutex_.test_and_set(std::memory_order_acquire))  // acquire lock
                  ; // spin
                
                if(!p->deps)
                  p->deps = p->lastdep = newdep;
                else {
                  p->lastdep->next = newdep;
                  p->lastdep = p->lastdep->next;
                }

                //lock.release();
                p->deps_mutex_.clear(std::memory_order_release);               // release lock
                
                DEPSPAWN_DEBUGACTION(
                                     /* You can be linking to Done's that are waiting for you to Fill-in
                                       but NOT for Deallocatable Workitems */
                                     if(p->status == Status_t::Deallocatable) {
                                       printf("%p -> Deallocatable %p (was %d)", this, p, (int)tmp_status);
                                       assert(false);
                                     }
                                     ); // END DEPSPAWN_DEBUGACTION
                if (arg_p->wr &&
                    (arg_w->is_array() ? arg_w->is_contained_array(arg_p) : contains(arg_p, arg_w))) {
                  nargs--;
                  /*
                  if (!nargs) {
                    DEPSPAWN_PROFILEACTION(profile_early_termination_lcl = true); //not true actually...
                    // The optimal thing would be to just make this goto to leave the main loop and insert
                    // the Workitem waiting. But in tests with repeated spawns this leads to very fast insertion
                    // that slows down the performance. Other advantages of continuing down the list:
                    // - More likely DEPSPAWN_FAST_START is triggered and it uses oldest tasks
                    // - optFlags_ is correctly computed
      
                    //goto OUT_MAIN_insert_in_worklist_LOOP;
      
                      argv[0] = nullptr;
                    //break; //There is another break anyway there down
                  } else {
                   */
                    for (int i = arg_w_i; i <= nargs; i++) {
                      argv[i] = argv[i+1];
                    }
                  /*}*/
                }
                break;
              } else {
                if(arg_p->addr < arg_w->addr) {
                  arg_p = arg_p->next;
                } else {
                  arg_w = argv[++arg_w_i];
                }
              }
            }
            
#ifdef DEPSPAWN_FAST_START
            const auto tmp_status = p->status;
            nfillwait += ( tmp_status < Status_t::Ready );
            if ( tmp_status == Status_t::Ready ) {
#ifdef DEPSPAWN_USE_TBB
              fast_arr[nready & (FAST_ARR_SZ - 1)] = p;
#endif
              nready++;
            }
#endif
            if( p->status == Status_t::Filling ) {
              optFlags_ |=  OptFlags::PendingFills;
            }
          }
        }
      }
      
//OUT_MAIN_insert_in_worklist_LOOP:
      
#ifdef DEPSPAWN_FAST_START
      if ((nready > FAST_THRESHOLD) || ((nready > Nthreads) && (nfillwait > FAST_THRESHOLD))) {
        DEPSPAWN_PROFILEACTION(profile_steal_attempts++);
#ifdef DEPSPAWN_USE_TBB
        nready = (nready - 1) & (FAST_ARR_SZ - 1);
        do {
          p = fast_arr[nready--];
          stolen_abf = p->steal();
        } while ( (stolen_abf == nullptr) && (nready >= 0) );
#else
        steal_work = true;
#endif
      }
#endif

      // This is set after stealing work because this way
      // the fast_arr workitems should not have been deallocated
      //status = (!ndependencies) ? Ready : Waiting;
      if (!ndependencies) {
        post();
      } else {
        status = Status_t::Waiting;
      }

#ifdef DEPSPAWN_FAST_START
#ifdef DEPSPAWN_USE_TBB
      if (stolen_abf != nullptr) {
        DEPSPAWN_PROFILEACTION(profile_steals++);
        stolen_abf->run_in_env(false);
        delete stolen_abf;
      }
#else
      if(steal_work && TP->try_run()) {
        DEPSPAWN_PROFILEACTION(profile_steals++);
      }
#endif
#endif
      
      DEPSPAWN_PROFILEACTION(
                             if(profile_early_termination_lcl) {
                               profile_early_terminations++;
                               profile_workitems_in_list_early_termination += profile_workitems_in_list_lcl;
                               profile_workitems_in_list_active_early_termination += profile_workitems_in_list_active_lcl;
                             }
                             profile_workitems_in_list += profile_workitems_in_list_lcl;
                             profile_workitems_in_list_active += profile_workitems_in_list_active_lcl;
                             );
    }